

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrasalrule.h
# Opt level: O2

ostream * jhu::thrax::operator<<(ostream *out,PhrasalRule *rule)

{
  int in_R8D;
  string_view nt;
  
  nt._M_str = (char *)0x0;
  nt._M_len = (size_t)(rule->lhs).label._M_str;
  bracket((thrax *)out,(ostream *)(rule->lhs).label._M_len,nt,in_R8D);
  std::__ostream_insert<char,std::char_traits<char>>(out,"\t",1);
  printRhs<true>(out,rule);
  std::__ostream_insert<char,std::char_traits<char>>(out,"\t",1);
  printRhs<false>(out,rule);
  std::__ostream_insert<char,std::char_traits<char>>(out,"\t",1);
  PhrasalRule::printAlignment(rule,out);
  return out;
}

Assistant:

inline std::ostream& operator<<(std::ostream& out, const PhrasalRule& rule) {
  const static std::string_view kSep = "\t";
  bracket(out, rule.lhs.label, kLhsIndex);
  out << kSep;
  printRhs<true>(out, rule);
  out << kSep;
  printRhs<false>(out, rule);
  out << kSep;
  rule.printAlignment(out);
  return out;
}